

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_weighted_pred_sse42_intr.c
# Opt level: O0

void ihevc_weighted_pred_bi_default_sse42
               (WORD16 *pi2_src1,WORD16 *pi2_src2,UWORD8 *pu1_dst,WORD32 src_strd1,WORD32 src_strd2,
               WORD32 dst_strd,WORD32 lvl_shift1,WORD32 lvl_shift2,WORD32 ht,WORD32 wd)

{
  undefined8 *puVar1;
  int in_ECX;
  undefined8 *in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  int in_R8D;
  int in_R9D;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  WORD32 dst1_1;
  WORD32 dst0_1;
  WORD32 dst3;
  WORD32 dst2;
  WORD32 dst1;
  WORD32 dst0;
  __m128i src_temp16_8x16b;
  __m128i src_temp15_8x16b;
  __m128i src_temp14_8x16b;
  __m128i src_temp13_8x16b;
  __m128i src_temp12_8x16b;
  __m128i src_temp11_8x16b;
  __m128i src_temp10_8x16b;
  __m128i src_temp9_8x16b;
  __m128i src_temp8_8x16b;
  __m128i src_temp7_8x16b;
  __m128i src_temp6_8x16b;
  __m128i src_temp5_8x16b;
  __m128i lvl_shift2_8x16b;
  __m128i lvl_shift1_8x16b;
  __m128i const_temp_8x16b;
  __m128i src_temp4_8x16b;
  __m128i src_temp3_8x16b;
  __m128i src_temp2_8x16b;
  __m128i src_temp1_8x16b;
  WORD32 shift;
  WORD32 temp;
  WORD32 col;
  WORD32 row;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  int local_c94;
  int local_c90;
  undefined8 *local_c80;
  undefined1 (*local_c78) [16];
  undefined1 (*local_c70) [16];
  short local_b98;
  short sStack_b96;
  short sStack_b94;
  short sStack_b92;
  short sStack_b90;
  short sStack_b8e;
  short sStack_b8c;
  short sStack_b8a;
  short local_b78;
  short sStack_b76;
  short sStack_b74;
  short sStack_b72;
  short sStack_b70;
  short sStack_b6e;
  short sStack_b6c;
  short sStack_b6a;
  short local_b58;
  short sStack_b56;
  short sStack_b54;
  short sStack_b52;
  short sStack_b50;
  short sStack_b4e;
  short sStack_b4c;
  short sStack_b4a;
  short local_b38;
  short sStack_b36;
  short sStack_b34;
  short sStack_b32;
  short sStack_b30;
  short sStack_b2e;
  short sStack_b2c;
  short sStack_b2a;
  short local_b18;
  short sStack_b16;
  short sStack_b14;
  short sStack_b12;
  short sStack_b10;
  short sStack_b0e;
  short sStack_b0c;
  short sStack_b0a;
  short local_af8;
  short sStack_af6;
  short sStack_af4;
  short sStack_af2;
  short sStack_af0;
  short sStack_aee;
  short sStack_aec;
  short sStack_aea;
  short local_ad8;
  short sStack_ad6;
  short sStack_ad4;
  short sStack_ad2;
  short sStack_ad0;
  short sStack_ace;
  short sStack_acc;
  short sStack_aca;
  short local_ac8;
  short sStack_ac6;
  short sStack_ac4;
  short sStack_ac2;
  short sStack_ac0;
  short sStack_abe;
  short sStack_abc;
  short sStack_aba;
  short local_ab8;
  short sStack_ab6;
  short sStack_ab4;
  short sStack_ab2;
  short sStack_ab0;
  short sStack_aae;
  short sStack_aac;
  short sStack_aaa;
  short local_aa8;
  short sStack_aa6;
  short sStack_aa4;
  short sStack_aa2;
  short sStack_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  short local_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  short sStack_a90;
  short sStack_a8e;
  short sStack_a8c;
  short sStack_a8a;
  short local_a88;
  short sStack_a86;
  short sStack_a84;
  short sStack_a82;
  short sStack_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  short local_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short local_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  short sStack_a60;
  short sStack_a5e;
  short sStack_a5c;
  short sStack_a5a;
  short local_a58;
  short sStack_a56;
  short sStack_a54;
  short sStack_a52;
  short sStack_a50;
  short sStack_a4e;
  short sStack_a4c;
  short sStack_a4a;
  
  if ((int)(uint)src_temp16_8x16b[0] % 4 != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_sse42_intr.c"
                  ,0x707,
                  "void ihevc_weighted_pred_bi_default_sse42(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  if (dst1 % 2 != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_weighted_pred_sse42_intr.c"
                  ,0x708,
                  "void ihevc_weighted_pred_bi_default_sse42(WORD16 *, WORD16 *, UWORD8 *, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32, WORD32)"
                 );
  }
  auVar4._2_2_ = (undefined2)dst1_1;
  auVar4._0_2_ = (undefined2)dst1_1;
  auVar4._4_2_ = (undefined2)dst1_1;
  auVar4._6_2_ = (undefined2)dst1_1;
  auVar4._10_2_ = (undefined2)dst1_1;
  auVar4._8_2_ = (undefined2)dst1_1;
  auVar4._12_2_ = (undefined2)dst1_1;
  auVar4._14_2_ = (undefined2)dst1_1;
  auVar2._2_2_ = (undefined2)dst3;
  auVar2._0_2_ = (undefined2)dst3;
  auVar2._4_2_ = (undefined2)dst3;
  auVar2._6_2_ = (undefined2)dst3;
  auVar2._10_2_ = (undefined2)dst3;
  auVar2._8_2_ = (undefined2)dst3;
  auVar2._12_2_ = (undefined2)dst3;
  auVar2._14_2_ = (undefined2)dst3;
  auVar2 = paddsw(auVar4,auVar2);
  auVar3._8_8_ = 0x40004000400040;
  auVar3._0_8_ = 0x40004000400040;
  auVar3 = paddsw(auVar2,auVar3);
  local_c80 = in_RDX;
  local_c78 = in_RSI;
  local_c70 = in_RDI;
  if ((dst1 & 3U) == 0) {
    if (((uint)src_temp16_8x16b[0] & 0xf) == 0) {
      for (local_c90 = 0; local_c90 < dst1; local_c90 = local_c90 + 4) {
        for (local_c94 = 0; local_c94 < (int)(uint)src_temp16_8x16b[0]; local_c94 = local_c94 + 0x10
            ) {
          auVar2 = paddsw(*local_c70,*local_c78);
          auVar4 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)in_ECX * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)in_R8D * 2));
          auVar5 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)(in_ECX << 1) * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)(in_R8D << 1) * 2));
          auVar6 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)(in_ECX * 3) * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)(in_R8D * 3) * 2));
          auVar2 = paddsw(auVar2,auVar3);
          auVar4 = paddsw(auVar4,auVar3);
          auVar5 = paddsw(auVar5,auVar3);
          auVar6 = paddsw(auVar6,auVar3);
          auVar7 = paddsw(local_c70[1],local_c78[1]);
          auVar8 = paddsw(*(undefined1 (*) [16])(local_c70[1] + (long)in_ECX * 2),
                          *(undefined1 (*) [16])(local_c78[1] + (long)in_R8D * 2));
          auVar9 = paddsw(*(undefined1 (*) [16])(local_c70[1] + (long)(in_ECX << 1) * 2),
                          *(undefined1 (*) [16])(local_c78[1] + (long)(in_R8D << 1) * 2));
          auVar10 = paddsw(*(undefined1 (*) [16])(local_c70[1] + (long)(in_ECX * 3) * 2),
                           *(undefined1 (*) [16])(local_c78[1] + (long)(in_R8D * 3) * 2));
          auVar2 = psraw(auVar2,ZEXT416(7));
          auVar4 = psraw(auVar4,ZEXT416(7));
          auVar5 = psraw(auVar5,ZEXT416(7));
          auVar6 = psraw(auVar6,ZEXT416(7));
          auVar7 = paddsw(auVar7,auVar3);
          auVar8 = paddsw(auVar8,auVar3);
          auVar9 = paddsw(auVar9,auVar3);
          auVar10 = paddsw(auVar10,auVar3);
          auVar7 = psraw(auVar7,ZEXT416(7));
          auVar8 = psraw(auVar8,ZEXT416(7));
          auVar9 = psraw(auVar9,ZEXT416(7));
          auVar10 = psraw(auVar10,ZEXT416(7));
          local_a58 = auVar2._0_2_;
          sStack_a56 = auVar2._2_2_;
          sStack_a54 = auVar2._4_2_;
          sStack_a52 = auVar2._6_2_;
          sStack_a50 = auVar2._8_2_;
          sStack_a4e = auVar2._10_2_;
          sStack_a4c = auVar2._12_2_;
          sStack_a4a = auVar2._14_2_;
          local_a68 = auVar7._0_2_;
          sStack_a66 = auVar7._2_2_;
          sStack_a64 = auVar7._4_2_;
          sStack_a62 = auVar7._6_2_;
          sStack_a60 = auVar7._8_2_;
          sStack_a5e = auVar7._10_2_;
          sStack_a5c = auVar7._12_2_;
          sStack_a5a = auVar7._14_2_;
          local_cb8._0_2_ =
               CONCAT11((0 < sStack_a56) * (sStack_a56 < 0x100) * auVar2[2] - (0xff < sStack_a56),
                        (0 < local_a58) * (local_a58 < 0x100) * auVar2[0] - (0xff < local_a58));
          local_cb8._0_3_ =
               CONCAT12((0 < sStack_a54) * (sStack_a54 < 0x100) * auVar2[4] - (0xff < sStack_a54),
                        (undefined2)local_cb8);
          local_cb8._0_4_ =
               CONCAT13((0 < sStack_a52) * (sStack_a52 < 0x100) * auVar2[6] - (0xff < sStack_a52),
                        (undefined3)local_cb8);
          local_cb8._0_5_ =
               CONCAT14((0 < sStack_a50) * (sStack_a50 < 0x100) * auVar2[8] - (0xff < sStack_a50),
                        (undefined4)local_cb8);
          local_cb8._0_6_ =
               CONCAT15((0 < sStack_a4e) * (sStack_a4e < 0x100) * auVar2[10] - (0xff < sStack_a4e),
                        (undefined5)local_cb8);
          local_cb8._0_7_ =
               CONCAT16((0 < sStack_a4c) * (sStack_a4c < 0x100) * auVar2[0xc] - (0xff < sStack_a4c),
                        (undefined6)local_cb8);
          local_cb8 = CONCAT17((0 < sStack_a4a) * (sStack_a4a < 0x100) * auVar2[0xe] -
                               (0xff < sStack_a4a),(undefined7)local_cb8);
          uStack_cb0._0_1_ = (0 < local_a68) * (local_a68 < 0x100) * auVar7[0] - (0xff < local_a68);
          uStack_cb0._1_1_ =
               (0 < sStack_a66) * (sStack_a66 < 0x100) * auVar7[2] - (0xff < sStack_a66);
          uStack_cb0._2_1_ =
               (0 < sStack_a64) * (sStack_a64 < 0x100) * auVar7[4] - (0xff < sStack_a64);
          uStack_cb0._3_1_ =
               (0 < sStack_a62) * (sStack_a62 < 0x100) * auVar7[6] - (0xff < sStack_a62);
          uStack_cb0._4_1_ =
               (0 < sStack_a60) * (sStack_a60 < 0x100) * auVar7[8] - (0xff < sStack_a60);
          uStack_cb0._5_1_ =
               (0 < sStack_a5e) * (sStack_a5e < 0x100) * auVar7[10] - (0xff < sStack_a5e);
          uStack_cb0._6_1_ =
               (0 < sStack_a5c) * (sStack_a5c < 0x100) * auVar7[0xc] - (0xff < sStack_a5c);
          uStack_cb0._7_1_ =
               (0 < sStack_a5a) * (sStack_a5a < 0x100) * auVar7[0xe] - (0xff < sStack_a5a);
          local_a78 = auVar4._0_2_;
          sStack_a76 = auVar4._2_2_;
          sStack_a74 = auVar4._4_2_;
          sStack_a72 = auVar4._6_2_;
          sStack_a70 = auVar4._8_2_;
          sStack_a6e = auVar4._10_2_;
          sStack_a6c = auVar4._12_2_;
          sStack_a6a = auVar4._14_2_;
          local_a88 = auVar8._0_2_;
          sStack_a86 = auVar8._2_2_;
          sStack_a84 = auVar8._4_2_;
          sStack_a82 = auVar8._6_2_;
          sStack_a80 = auVar8._8_2_;
          sStack_a7e = auVar8._10_2_;
          sStack_a7c = auVar8._12_2_;
          sStack_a7a = auVar8._14_2_;
          local_cd8._0_2_ =
               CONCAT11((0 < sStack_a76) * (sStack_a76 < 0x100) * auVar4[2] - (0xff < sStack_a76),
                        (0 < local_a78) * (local_a78 < 0x100) * auVar4[0] - (0xff < local_a78));
          local_cd8._0_3_ =
               CONCAT12((0 < sStack_a74) * (sStack_a74 < 0x100) * auVar4[4] - (0xff < sStack_a74),
                        (undefined2)local_cd8);
          local_cd8._0_4_ =
               CONCAT13((0 < sStack_a72) * (sStack_a72 < 0x100) * auVar4[6] - (0xff < sStack_a72),
                        (undefined3)local_cd8);
          local_cd8._0_5_ =
               CONCAT14((0 < sStack_a70) * (sStack_a70 < 0x100) * auVar4[8] - (0xff < sStack_a70),
                        (undefined4)local_cd8);
          local_cd8._0_6_ =
               CONCAT15((0 < sStack_a6e) * (sStack_a6e < 0x100) * auVar4[10] - (0xff < sStack_a6e),
                        (undefined5)local_cd8);
          local_cd8._0_7_ =
               CONCAT16((0 < sStack_a6c) * (sStack_a6c < 0x100) * auVar4[0xc] - (0xff < sStack_a6c),
                        (undefined6)local_cd8);
          local_cd8 = CONCAT17((0 < sStack_a6a) * (sStack_a6a < 0x100) * auVar4[0xe] -
                               (0xff < sStack_a6a),(undefined7)local_cd8);
          uStack_cd0._0_1_ = (0 < local_a88) * (local_a88 < 0x100) * auVar8[0] - (0xff < local_a88);
          uStack_cd0._1_1_ =
               (0 < sStack_a86) * (sStack_a86 < 0x100) * auVar8[2] - (0xff < sStack_a86);
          uStack_cd0._2_1_ =
               (0 < sStack_a84) * (sStack_a84 < 0x100) * auVar8[4] - (0xff < sStack_a84);
          uStack_cd0._3_1_ =
               (0 < sStack_a82) * (sStack_a82 < 0x100) * auVar8[6] - (0xff < sStack_a82);
          uStack_cd0._4_1_ =
               (0 < sStack_a80) * (sStack_a80 < 0x100) * auVar8[8] - (0xff < sStack_a80);
          uStack_cd0._5_1_ =
               (0 < sStack_a7e) * (sStack_a7e < 0x100) * auVar8[10] - (0xff < sStack_a7e);
          uStack_cd0._6_1_ =
               (0 < sStack_a7c) * (sStack_a7c < 0x100) * auVar8[0xc] - (0xff < sStack_a7c);
          uStack_cd0._7_1_ =
               (0 < sStack_a7a) * (sStack_a7a < 0x100) * auVar8[0xe] - (0xff < sStack_a7a);
          local_a98 = auVar5._0_2_;
          sStack_a96 = auVar5._2_2_;
          sStack_a94 = auVar5._4_2_;
          sStack_a92 = auVar5._6_2_;
          sStack_a90 = auVar5._8_2_;
          sStack_a8e = auVar5._10_2_;
          sStack_a8c = auVar5._12_2_;
          sStack_a8a = auVar5._14_2_;
          local_aa8 = auVar9._0_2_;
          sStack_aa6 = auVar9._2_2_;
          sStack_aa4 = auVar9._4_2_;
          sStack_aa2 = auVar9._6_2_;
          sStack_aa0 = auVar9._8_2_;
          sStack_a9e = auVar9._10_2_;
          sStack_a9c = auVar9._12_2_;
          sStack_a9a = auVar9._14_2_;
          local_d28._0_2_ =
               CONCAT11((0 < sStack_a96) * (sStack_a96 < 0x100) * auVar5[2] - (0xff < sStack_a96),
                        (0 < local_a98) * (local_a98 < 0x100) * auVar5[0] - (0xff < local_a98));
          local_d28._0_3_ =
               CONCAT12((0 < sStack_a94) * (sStack_a94 < 0x100) * auVar5[4] - (0xff < sStack_a94),
                        (undefined2)local_d28);
          local_d28._0_4_ =
               CONCAT13((0 < sStack_a92) * (sStack_a92 < 0x100) * auVar5[6] - (0xff < sStack_a92),
                        (undefined3)local_d28);
          local_d28._0_5_ =
               CONCAT14((0 < sStack_a90) * (sStack_a90 < 0x100) * auVar5[8] - (0xff < sStack_a90),
                        (undefined4)local_d28);
          local_d28._0_6_ =
               CONCAT15((0 < sStack_a8e) * (sStack_a8e < 0x100) * auVar5[10] - (0xff < sStack_a8e),
                        (undefined5)local_d28);
          local_d28._0_7_ =
               CONCAT16((0 < sStack_a8c) * (sStack_a8c < 0x100) * auVar5[0xc] - (0xff < sStack_a8c),
                        (undefined6)local_d28);
          local_d28 = CONCAT17((0 < sStack_a8a) * (sStack_a8a < 0x100) * auVar5[0xe] -
                               (0xff < sStack_a8a),(undefined7)local_d28);
          uStack_d20._0_1_ = (0 < local_aa8) * (local_aa8 < 0x100) * auVar9[0] - (0xff < local_aa8);
          uStack_d20._1_1_ =
               (0 < sStack_aa6) * (sStack_aa6 < 0x100) * auVar9[2] - (0xff < sStack_aa6);
          uStack_d20._2_1_ =
               (0 < sStack_aa4) * (sStack_aa4 < 0x100) * auVar9[4] - (0xff < sStack_aa4);
          uStack_d20._3_1_ =
               (0 < sStack_aa2) * (sStack_aa2 < 0x100) * auVar9[6] - (0xff < sStack_aa2);
          uStack_d20._4_1_ =
               (0 < sStack_aa0) * (sStack_aa0 < 0x100) * auVar9[8] - (0xff < sStack_aa0);
          uStack_d20._5_1_ =
               (0 < sStack_a9e) * (sStack_a9e < 0x100) * auVar9[10] - (0xff < sStack_a9e);
          uStack_d20._6_1_ =
               (0 < sStack_a9c) * (sStack_a9c < 0x100) * auVar9[0xc] - (0xff < sStack_a9c);
          uStack_d20._7_1_ =
               (0 < sStack_a9a) * (sStack_a9a < 0x100) * auVar9[0xe] - (0xff < sStack_a9a);
          local_ab8 = auVar6._0_2_;
          sStack_ab6 = auVar6._2_2_;
          sStack_ab4 = auVar6._4_2_;
          sStack_ab2 = auVar6._6_2_;
          sStack_ab0 = auVar6._8_2_;
          sStack_aae = auVar6._10_2_;
          sStack_aac = auVar6._12_2_;
          sStack_aaa = auVar6._14_2_;
          local_ac8 = auVar10._0_2_;
          sStack_ac6 = auVar10._2_2_;
          sStack_ac4 = auVar10._4_2_;
          sStack_ac2 = auVar10._6_2_;
          sStack_ac0 = auVar10._8_2_;
          sStack_abe = auVar10._10_2_;
          sStack_abc = auVar10._12_2_;
          sStack_aba = auVar10._14_2_;
          local_d48._0_2_ =
               CONCAT11((0 < sStack_ab6) * (sStack_ab6 < 0x100) * auVar6[2] - (0xff < sStack_ab6),
                        (0 < local_ab8) * (local_ab8 < 0x100) * auVar6[0] - (0xff < local_ab8));
          local_d48._0_3_ =
               CONCAT12((0 < sStack_ab4) * (sStack_ab4 < 0x100) * auVar6[4] - (0xff < sStack_ab4),
                        (undefined2)local_d48);
          local_d48._0_4_ =
               CONCAT13((0 < sStack_ab2) * (sStack_ab2 < 0x100) * auVar6[6] - (0xff < sStack_ab2),
                        (undefined3)local_d48);
          local_d48._0_5_ =
               CONCAT14((0 < sStack_ab0) * (sStack_ab0 < 0x100) * auVar6[8] - (0xff < sStack_ab0),
                        (undefined4)local_d48);
          local_d48._0_6_ =
               CONCAT15((0 < sStack_aae) * (sStack_aae < 0x100) * auVar6[10] - (0xff < sStack_aae),
                        (undefined5)local_d48);
          local_d48._0_7_ =
               CONCAT16((0 < sStack_aac) * (sStack_aac < 0x100) * auVar6[0xc] - (0xff < sStack_aac),
                        (undefined6)local_d48);
          local_d48 = CONCAT17((0 < sStack_aaa) * (sStack_aaa < 0x100) * auVar6[0xe] -
                               (0xff < sStack_aaa),(undefined7)local_d48);
          uStack_d40._0_1_ = (0 < local_ac8) * (local_ac8 < 0x100) * auVar10[0] - (0xff < local_ac8)
          ;
          uStack_d40._1_1_ =
               (0 < sStack_ac6) * (sStack_ac6 < 0x100) * auVar10[2] - (0xff < sStack_ac6);
          uStack_d40._2_1_ =
               (0 < sStack_ac4) * (sStack_ac4 < 0x100) * auVar10[4] - (0xff < sStack_ac4);
          uStack_d40._3_1_ =
               (0 < sStack_ac2) * (sStack_ac2 < 0x100) * auVar10[6] - (0xff < sStack_ac2);
          uStack_d40._4_1_ =
               (0 < sStack_ac0) * (sStack_ac0 < 0x100) * auVar10[8] - (0xff < sStack_ac0);
          uStack_d40._5_1_ =
               (0 < sStack_abe) * (sStack_abe < 0x100) * auVar10[10] - (0xff < sStack_abe);
          uStack_d40._6_1_ =
               (0 < sStack_abc) * (sStack_abc < 0x100) * auVar10[0xc] - (0xff < sStack_abc);
          uStack_d40._7_1_ =
               (0 < sStack_aba) * (sStack_aba < 0x100) * auVar10[0xe] - (0xff < sStack_aba);
          *local_c80 = local_cb8;
          local_c80[1] = uStack_cb0;
          *(undefined8 *)((long)local_c80 + (long)in_R9D) = local_cd8;
          ((undefined8 *)((long)local_c80 + (long)in_R9D))[1] = uStack_cd0;
          puVar1 = (undefined8 *)((long)local_c80 + (long)(in_R9D << 1));
          *puVar1 = local_d28;
          puVar1[1] = uStack_d20;
          puVar1 = (undefined8 *)((long)local_c80 + (long)(in_R9D * 3));
          *puVar1 = local_d48;
          puVar1[1] = uStack_d40;
          local_c70 = local_c70 + 2;
          local_c78 = local_c78 + 2;
          local_c80 = local_c80 + 2;
        }
        local_c70 = (undefined1 (*) [16])
                    ((long)local_c70 +
                    (long)(in_ECX << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c78 = (undefined1 (*) [16])
                    ((long)local_c78 +
                    (long)(in_R8D << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c80 = (undefined8 *)
                    ((long)local_c80 + ((long)(in_R9D << 2) - (long)(int)(uint)src_temp16_8x16b[0]))
        ;
      }
    }
    else if (((uint)src_temp16_8x16b[0] & 7) == 0) {
      for (local_c90 = 0; local_c90 < dst1; local_c90 = local_c90 + 4) {
        for (local_c94 = 0; local_c94 < (int)(uint)src_temp16_8x16b[0]; local_c94 = local_c94 + 8) {
          auVar2 = paddsw(*local_c70,*local_c78);
          auVar4 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)in_ECX * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)in_R8D * 2));
          auVar5 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)(in_ECX * 2) * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)(in_R8D * 2) * 2));
          auVar6 = paddsw(*(undefined1 (*) [16])(*local_c70 + (long)(in_ECX * 3) * 2),
                          *(undefined1 (*) [16])(*local_c78 + (long)(in_R8D * 3) * 2));
          auVar2 = paddsw(auVar2,auVar3);
          auVar4 = paddsw(auVar4,auVar3);
          auVar5 = paddsw(auVar5,auVar3);
          auVar6 = paddsw(auVar6,auVar3);
          auVar2 = psraw(auVar2,ZEXT416(7));
          auVar4 = psraw(auVar4,ZEXT416(7));
          auVar5 = psraw(auVar5,ZEXT416(7));
          auVar6 = psraw(auVar6,ZEXT416(7));
          local_ad8 = auVar2._0_2_;
          sStack_ad6 = auVar2._2_2_;
          sStack_ad4 = auVar2._4_2_;
          sStack_ad2 = auVar2._6_2_;
          sStack_ad0 = auVar2._8_2_;
          sStack_ace = auVar2._10_2_;
          sStack_acc = auVar2._12_2_;
          sStack_aca = auVar2._14_2_;
          local_cb8._0_2_ =
               CONCAT11((0 < sStack_ad6) * (sStack_ad6 < 0x100) * auVar2[2] - (0xff < sStack_ad6),
                        (0 < local_ad8) * (local_ad8 < 0x100) * auVar2[0] - (0xff < local_ad8));
          local_cb8._0_3_ =
               CONCAT12((0 < sStack_ad4) * (sStack_ad4 < 0x100) * auVar2[4] - (0xff < sStack_ad4),
                        (undefined2)local_cb8);
          local_cb8._0_4_ =
               CONCAT13((0 < sStack_ad2) * (sStack_ad2 < 0x100) * auVar2[6] - (0xff < sStack_ad2),
                        (undefined3)local_cb8);
          local_cb8._0_5_ =
               CONCAT14((0 < sStack_ad0) * (sStack_ad0 < 0x100) * auVar2[8] - (0xff < sStack_ad0),
                        (undefined4)local_cb8);
          local_cb8._0_6_ =
               CONCAT15((0 < sStack_ace) * (sStack_ace < 0x100) * auVar2[10] - (0xff < sStack_ace),
                        (undefined5)local_cb8);
          local_cb8._0_7_ =
               CONCAT16((0 < sStack_acc) * (sStack_acc < 0x100) * auVar2[0xc] - (0xff < sStack_acc),
                        (undefined6)local_cb8);
          local_cb8 = CONCAT17((0 < sStack_aca) * (sStack_aca < 0x100) * auVar2[0xe] -
                               (0xff < sStack_aca),(undefined7)local_cb8);
          local_af8 = auVar4._0_2_;
          sStack_af6 = auVar4._2_2_;
          sStack_af4 = auVar4._4_2_;
          sStack_af2 = auVar4._6_2_;
          sStack_af0 = auVar4._8_2_;
          sStack_aee = auVar4._10_2_;
          sStack_aec = auVar4._12_2_;
          sStack_aea = auVar4._14_2_;
          local_cd8._0_2_ =
               CONCAT11((0 < sStack_af6) * (sStack_af6 < 0x100) * auVar4[2] - (0xff < sStack_af6),
                        (0 < local_af8) * (local_af8 < 0x100) * auVar4[0] - (0xff < local_af8));
          local_cd8._0_3_ =
               CONCAT12((0 < sStack_af4) * (sStack_af4 < 0x100) * auVar4[4] - (0xff < sStack_af4),
                        (undefined2)local_cd8);
          local_cd8._0_4_ =
               CONCAT13((0 < sStack_af2) * (sStack_af2 < 0x100) * auVar4[6] - (0xff < sStack_af2),
                        (undefined3)local_cd8);
          local_cd8._0_5_ =
               CONCAT14((0 < sStack_af0) * (sStack_af0 < 0x100) * auVar4[8] - (0xff < sStack_af0),
                        (undefined4)local_cd8);
          local_cd8._0_6_ =
               CONCAT15((0 < sStack_aee) * (sStack_aee < 0x100) * auVar4[10] - (0xff < sStack_aee),
                        (undefined5)local_cd8);
          local_cd8._0_7_ =
               CONCAT16((0 < sStack_aec) * (sStack_aec < 0x100) * auVar4[0xc] - (0xff < sStack_aec),
                        (undefined6)local_cd8);
          local_cd8 = CONCAT17((0 < sStack_aea) * (sStack_aea < 0x100) * auVar4[0xe] -
                               (0xff < sStack_aea),(undefined7)local_cd8);
          local_b18 = auVar5._0_2_;
          sStack_b16 = auVar5._2_2_;
          sStack_b14 = auVar5._4_2_;
          sStack_b12 = auVar5._6_2_;
          sStack_b10 = auVar5._8_2_;
          sStack_b0e = auVar5._10_2_;
          sStack_b0c = auVar5._12_2_;
          sStack_b0a = auVar5._14_2_;
          local_d28._0_2_ =
               CONCAT11((0 < sStack_b16) * (sStack_b16 < 0x100) * auVar5[2] - (0xff < sStack_b16),
                        (0 < local_b18) * (local_b18 < 0x100) * auVar5[0] - (0xff < local_b18));
          local_d28._0_3_ =
               CONCAT12((0 < sStack_b14) * (sStack_b14 < 0x100) * auVar5[4] - (0xff < sStack_b14),
                        (undefined2)local_d28);
          local_d28._0_4_ =
               CONCAT13((0 < sStack_b12) * (sStack_b12 < 0x100) * auVar5[6] - (0xff < sStack_b12),
                        (undefined3)local_d28);
          local_d28._0_5_ =
               CONCAT14((0 < sStack_b10) * (sStack_b10 < 0x100) * auVar5[8] - (0xff < sStack_b10),
                        (undefined4)local_d28);
          local_d28._0_6_ =
               CONCAT15((0 < sStack_b0e) * (sStack_b0e < 0x100) * auVar5[10] - (0xff < sStack_b0e),
                        (undefined5)local_d28);
          local_d28._0_7_ =
               CONCAT16((0 < sStack_b0c) * (sStack_b0c < 0x100) * auVar5[0xc] - (0xff < sStack_b0c),
                        (undefined6)local_d28);
          local_d28 = CONCAT17((0 < sStack_b0a) * (sStack_b0a < 0x100) * auVar5[0xe] -
                               (0xff < sStack_b0a),(undefined7)local_d28);
          local_b38 = auVar6._0_2_;
          sStack_b36 = auVar6._2_2_;
          sStack_b34 = auVar6._4_2_;
          sStack_b32 = auVar6._6_2_;
          sStack_b30 = auVar6._8_2_;
          sStack_b2e = auVar6._10_2_;
          sStack_b2c = auVar6._12_2_;
          sStack_b2a = auVar6._14_2_;
          local_d48._0_2_ =
               CONCAT11((0 < sStack_b36) * (sStack_b36 < 0x100) * auVar6[2] - (0xff < sStack_b36),
                        (0 < local_b38) * (local_b38 < 0x100) * auVar6[0] - (0xff < local_b38));
          local_d48._0_3_ =
               CONCAT12((0 < sStack_b34) * (sStack_b34 < 0x100) * auVar6[4] - (0xff < sStack_b34),
                        (undefined2)local_d48);
          local_d48._0_4_ =
               CONCAT13((0 < sStack_b32) * (sStack_b32 < 0x100) * auVar6[6] - (0xff < sStack_b32),
                        (undefined3)local_d48);
          local_d48._0_5_ =
               CONCAT14((0 < sStack_b30) * (sStack_b30 < 0x100) * auVar6[8] - (0xff < sStack_b30),
                        (undefined4)local_d48);
          local_d48._0_6_ =
               CONCAT15((0 < sStack_b2e) * (sStack_b2e < 0x100) * auVar6[10] - (0xff < sStack_b2e),
                        (undefined5)local_d48);
          local_d48._0_7_ =
               CONCAT16((0 < sStack_b2c) * (sStack_b2c < 0x100) * auVar6[0xc] - (0xff < sStack_b2c),
                        (undefined6)local_d48);
          local_d48 = CONCAT17((0 < sStack_b2a) * (sStack_b2a < 0x100) * auVar6[0xe] -
                               (0xff < sStack_b2a),(undefined7)local_d48);
          *local_c80 = local_cb8;
          *(undefined8 *)((long)local_c80 + (long)in_R9D) = local_cd8;
          *(undefined8 *)((long)local_c80 + (long)(in_R9D * 2)) = local_d28;
          *(undefined8 *)((long)local_c80 + (long)(in_R9D * 3)) = local_d48;
          local_c70 = local_c70 + 1;
          local_c78 = local_c78 + 1;
          local_c80 = local_c80 + 1;
        }
        local_c70 = (undefined1 (*) [16])
                    ((long)local_c70 +
                    (long)(in_ECX << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c78 = (undefined1 (*) [16])
                    ((long)local_c78 +
                    (long)(in_R8D << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c80 = (undefined8 *)
                    ((long)local_c80 + ((long)(in_R9D << 2) - (long)(int)(uint)src_temp16_8x16b[0]))
        ;
      }
    }
    else {
      for (local_c90 = 0; local_c90 < dst1; local_c90 = local_c90 + 4) {
        for (local_c94 = 0; local_c94 < (int)(uint)src_temp16_8x16b[0]; local_c94 = local_c94 + 4) {
          auVar10._8_8_ = *(undefined8 *)(*local_c70 + (long)in_ECX * 2);
          auVar10._0_8_ = *(undefined8 *)*local_c70;
          auVar9._8_8_ = *(undefined8 *)(*local_c78 + (long)in_R8D * 2);
          auVar9._0_8_ = *(undefined8 *)*local_c78;
          auVar2 = paddsw(auVar10,auVar9);
          auVar8._8_8_ = *(undefined8 *)(*local_c70 + (long)(in_ECX * 3) * 2);
          auVar8._0_8_ = *(undefined8 *)(*local_c70 + (long)(in_ECX * 2) * 2);
          auVar7._8_8_ = *(undefined8 *)(*local_c78 + (long)(in_R8D * 3) * 2);
          auVar7._0_8_ = *(undefined8 *)(*local_c78 + (long)(in_R8D * 2) * 2);
          auVar4 = paddsw(auVar8,auVar7);
          auVar2 = paddsw(auVar2,auVar3);
          auVar4 = paddsw(auVar4,auVar3);
          auVar2 = psraw(auVar2,ZEXT416(7));
          auVar4 = psraw(auVar4,ZEXT416(7));
          local_b58 = auVar2._0_2_;
          sStack_b56 = auVar2._2_2_;
          sStack_b54 = auVar2._4_2_;
          sStack_b52 = auVar2._6_2_;
          sStack_b50 = auVar2._8_2_;
          sStack_b4e = auVar2._10_2_;
          sStack_b4c = auVar2._12_2_;
          sStack_b4a = auVar2._14_2_;
          local_cb8._0_2_ =
               CONCAT11((0 < sStack_b56) * (sStack_b56 < 0x100) * auVar2[2] - (0xff < sStack_b56),
                        (0 < local_b58) * (local_b58 < 0x100) * auVar2[0] - (0xff < local_b58));
          local_cb8._0_3_ =
               CONCAT12((0 < sStack_b54) * (sStack_b54 < 0x100) * auVar2[4] - (0xff < sStack_b54),
                        (undefined2)local_cb8);
          local_cb8._0_4_ =
               CONCAT13((0 < sStack_b52) * (sStack_b52 < 0x100) * auVar2[6] - (0xff < sStack_b52),
                        (undefined3)local_cb8);
          local_cb8._0_5_ =
               CONCAT14((0 < sStack_b50) * (sStack_b50 < 0x100) * auVar2[8] - (0xff < sStack_b50),
                        (undefined4)local_cb8);
          local_cb8._0_6_ =
               CONCAT15((0 < sStack_b4e) * (sStack_b4e < 0x100) * auVar2[10] - (0xff < sStack_b4e),
                        (undefined5)local_cb8);
          local_cb8._0_7_ =
               CONCAT16((0 < sStack_b4c) * (sStack_b4c < 0x100) * auVar2[0xc] - (0xff < sStack_b4c),
                        (undefined6)local_cb8);
          local_cb8 = CONCAT17((0 < sStack_b4a) * (sStack_b4a < 0x100) * auVar2[0xe] -
                               (0xff < sStack_b4a),(undefined7)local_cb8);
          local_b78 = auVar4._0_2_;
          sStack_b76 = auVar4._2_2_;
          sStack_b74 = auVar4._4_2_;
          sStack_b72 = auVar4._6_2_;
          sStack_b70 = auVar4._8_2_;
          sStack_b6e = auVar4._10_2_;
          sStack_b6c = auVar4._12_2_;
          sStack_b6a = auVar4._14_2_;
          local_d28._0_2_ =
               CONCAT11((0 < sStack_b76) * (sStack_b76 < 0x100) * auVar4[2] - (0xff < sStack_b76),
                        (0 < local_b78) * (local_b78 < 0x100) * auVar4[0] - (0xff < local_b78));
          local_d28._0_3_ =
               CONCAT12((0 < sStack_b74) * (sStack_b74 < 0x100) * auVar4[4] - (0xff < sStack_b74),
                        (undefined2)local_d28);
          local_d28._0_4_ =
               CONCAT13((0 < sStack_b72) * (sStack_b72 < 0x100) * auVar4[6] - (0xff < sStack_b72),
                        (undefined3)local_d28);
          local_d28._0_5_ =
               CONCAT14((0 < sStack_b70) * (sStack_b70 < 0x100) * auVar4[8] - (0xff < sStack_b70),
                        (undefined4)local_d28);
          local_d28._0_6_ =
               CONCAT15((0 < sStack_b6e) * (sStack_b6e < 0x100) * auVar4[10] - (0xff < sStack_b6e),
                        (undefined5)local_d28);
          local_d28._0_7_ =
               CONCAT16((0 < sStack_b6c) * (sStack_b6c < 0x100) * auVar4[0xc] - (0xff < sStack_b6c),
                        (undefined6)local_d28);
          local_d28 = CONCAT17((0 < sStack_b6a) * (sStack_b6a < 0x100) * auVar4[0xe] -
                               (0xff < sStack_b6a),(undefined7)local_d28);
          *(undefined4 *)local_c80 = (undefined4)local_cb8;
          *(undefined4 *)((long)local_c80 + (long)in_R9D) = local_cb8._4_4_;
          *(undefined4 *)((long)local_c80 + (long)(in_R9D << 1)) = (undefined4)local_d28;
          *(undefined4 *)((long)local_c80 + (long)(in_R9D * 3)) = local_d28._4_4_;
          local_c70 = (undefined1 (*) [16])(*local_c70 + 8);
          local_c78 = (undefined1 (*) [16])(*local_c78 + 8);
          local_c80 = (undefined8 *)((long)local_c80 + 4);
        }
        local_c70 = (undefined1 (*) [16])
                    ((long)local_c70 +
                    (long)(in_ECX << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c78 = (undefined1 (*) [16])
                    ((long)local_c78 +
                    (long)(in_R8D << 2) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
        local_c80 = (undefined8 *)
                    ((long)local_c80 + ((long)(in_R9D << 2) - (long)(int)(uint)src_temp16_8x16b[0]))
        ;
      }
    }
  }
  else {
    for (local_c90 = 0; local_c90 < dst1; local_c90 = local_c90 + 2) {
      for (local_c94 = 0; local_c94 < (int)(uint)src_temp16_8x16b[0]; local_c94 = local_c94 + 4) {
        auVar6._8_8_ = *(undefined8 *)(*local_c70 + (long)in_ECX * 2);
        auVar6._0_8_ = *(undefined8 *)*local_c70;
        auVar5._8_8_ = *(undefined8 *)(*local_c78 + (long)in_R8D * 2);
        auVar5._0_8_ = *(undefined8 *)*local_c78;
        auVar2 = paddsw(auVar6,auVar5);
        auVar2 = paddsw(auVar2,auVar3);
        auVar2 = psraw(auVar2,ZEXT416(7));
        local_b98 = auVar2._0_2_;
        sStack_b96 = auVar2._2_2_;
        sStack_b94 = auVar2._4_2_;
        sStack_b92 = auVar2._6_2_;
        sStack_b90 = auVar2._8_2_;
        sStack_b8e = auVar2._10_2_;
        sStack_b8c = auVar2._12_2_;
        sStack_b8a = auVar2._14_2_;
        local_cb8._0_2_ =
             CONCAT11((0 < sStack_b96) * (sStack_b96 < 0x100) * auVar2[2] - (0xff < sStack_b96),
                      (0 < local_b98) * (local_b98 < 0x100) * auVar2[0] - (0xff < local_b98));
        local_cb8._0_3_ =
             CONCAT12((0 < sStack_b94) * (sStack_b94 < 0x100) * auVar2[4] - (0xff < sStack_b94),
                      (undefined2)local_cb8);
        local_cb8._0_4_ =
             CONCAT13((0 < sStack_b92) * (sStack_b92 < 0x100) * auVar2[6] - (0xff < sStack_b92),
                      (undefined3)local_cb8);
        local_cb8._0_5_ =
             CONCAT14((0 < sStack_b90) * (sStack_b90 < 0x100) * auVar2[8] - (0xff < sStack_b90),
                      (undefined4)local_cb8);
        local_cb8._0_6_ =
             CONCAT15((0 < sStack_b8e) * (sStack_b8e < 0x100) * auVar2[10] - (0xff < sStack_b8e),
                      (undefined5)local_cb8);
        local_cb8._0_7_ =
             CONCAT16((0 < sStack_b8c) * (sStack_b8c < 0x100) * auVar2[0xc] - (0xff < sStack_b8c),
                      (undefined6)local_cb8);
        local_cb8 = CONCAT17((0 < sStack_b8a) * (sStack_b8a < 0x100) * auVar2[0xe] -
                             (0xff < sStack_b8a),(undefined7)local_cb8);
        *(undefined4 *)local_c80 = (undefined4)local_cb8;
        *(undefined4 *)((long)local_c80 + (long)in_R9D) = local_cb8._4_4_;
        local_c70 = (undefined1 (*) [16])(*local_c70 + 8);
        local_c78 = (undefined1 (*) [16])(*local_c78 + 8);
        local_c80 = (undefined8 *)((long)local_c80 + 4);
      }
      local_c70 = (undefined1 (*) [16])
                  ((long)local_c70 +
                  (long)(in_ECX << 1) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
      local_c78 = (undefined1 (*) [16])
                  ((long)local_c78 +
                  (long)(in_R8D << 1) * 2 + (long)(int)(uint)src_temp16_8x16b[0] * -2);
      local_c80 = (undefined8 *)
                  ((long)local_c80 + ((long)(in_R9D << 1) - (long)(int)(uint)src_temp16_8x16b[0]));
    }
  }
  return;
}

Assistant:

void ihevc_weighted_pred_bi_default_sse42(WORD16 *pi2_src1,
                                          WORD16 *pi2_src2,
                                          UWORD8 *pu1_dst,
                                          WORD32 src_strd1,
                                          WORD32 src_strd2,
                                          WORD32 dst_strd,
                                          WORD32 lvl_shift1,
                                          WORD32 lvl_shift2,
                                          WORD32 ht,
                                          WORD32 wd)
{
    WORD32 row, col, temp;
    WORD32 shift;

    __m128i src_temp1_8x16b, src_temp2_8x16b, src_temp3_8x16b, src_temp4_8x16b;
    __m128i const_temp_8x16b, lvl_shift1_8x16b, lvl_shift2_8x16b;
    __m128i src_temp5_8x16b, src_temp6_8x16b, src_temp7_8x16b, src_temp8_8x16b;

    ASSERT(wd % 4 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/

    shift = SHIFT_14_MINUS_BIT_DEPTH + 1;
    temp = 1 << (shift - 1);

    // seting values in register
    lvl_shift1_8x16b = _mm_set1_epi16(lvl_shift1);
    lvl_shift2_8x16b = _mm_set1_epi16(lvl_shift2);
    const_temp_8x16b = _mm_set1_epi16(temp);

    lvl_shift1_8x16b = _mm_adds_epi16(lvl_shift1_8x16b, lvl_shift2_8x16b);
    lvl_shift1_8x16b = _mm_adds_epi16(lvl_shift1_8x16b, const_temp_8x16b);

    if(0 == (ht & 3)) /* ht multiple of 4*/
    {
        if(0 == (wd & 15)) /* wd multiple of 16 case */
        {
            __m128i src_temp9_8x16b,  src_temp10_8x16b, src_temp11_8x16b, src_temp12_8x16b;
            __m128i src_temp13_8x16b, src_temp14_8x16b, src_temp15_8x16b, src_temp16_8x16b;
            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 16)
                {
                    /*load 8 pixel values */ /* First 8 Values */
                    src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1));
                    src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2));
                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /*load 8 pixel values */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_loadu_si128((__m128i *)(pi2_src1 + 8));
                    src_temp10_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 8));
                    /* row = 1 */
                    src_temp11_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1 + 8));
                    src_temp12_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2 + 8));
                    /* row = 2 */
                    src_temp13_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1 + 8));
                    src_temp14_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2 + 8));

                    /* (pi2_src1[col] + pi2_src2[col]) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, src_temp8_8x16b);

                    /*load 8 pixel values */ /* Second 8 Values */
                    /* row = 3 */
                    src_temp15_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1 + 8));
                    src_temp16_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2 + 8));

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, lvl_shift1_8x16b);

                    /* (pi2_src1[col] + pi2_src2[col]) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_adds_epi16(src_temp9_8x16b,  src_temp10_8x16b);
                    src_temp11_8x16b = _mm_adds_epi16(src_temp11_8x16b, src_temp12_8x16b);
                    src_temp13_8x16b = _mm_adds_epi16(src_temp13_8x16b, src_temp14_8x16b);
                    src_temp15_8x16b = _mm_adds_epi16(src_temp15_8x16b, src_temp16_8x16b);

                    /* (i4_tmp >> shift) */ /* First 8 Values */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);
                    src_temp7_8x16b = _mm_srai_epi16(src_temp7_8x16b,  shift);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_adds_epi16(src_temp9_8x16b, lvl_shift1_8x16b);
                    src_temp11_8x16b = _mm_adds_epi16(src_temp11_8x16b, lvl_shift1_8x16b);
                    src_temp13_8x16b = _mm_adds_epi16(src_temp13_8x16b, lvl_shift1_8x16b);
                    src_temp15_8x16b = _mm_adds_epi16(src_temp15_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */ /* Second 8 Values */
                    src_temp9_8x16b  = _mm_srai_epi16(src_temp9_8x16b,  shift);
                    src_temp11_8x16b = _mm_srai_epi16(src_temp11_8x16b,  shift);
                    src_temp13_8x16b = _mm_srai_epi16(src_temp13_8x16b,  shift);
                    src_temp15_8x16b = _mm_srai_epi16(src_temp15_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */ /* 16 8 Values */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp9_8x16b);
                    src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, src_temp11_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp13_8x16b);
                    src_temp7_8x16b = _mm_packus_epi16(src_temp7_8x16b, src_temp15_8x16b);

                    /* store four 8-bit output values  */ /* 16 8 Values */
                    _mm_storeu_si128((__m128i *)(pu1_dst + 0 * dst_strd), src_temp1_8x16b); /* row = 0*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 1 * dst_strd), src_temp3_8x16b); /* row = 2*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 2 * dst_strd), src_temp5_8x16b); /* row = 1*/
                    _mm_storeu_si128((__m128i *)(pu1_dst + 3 * dst_strd), src_temp7_8x16b); /* row = 3*/

                    /* To update pointer */
                    pi2_src1 += 16;
                    pi2_src2 += 16;
                    pu1_dst  += 16;

                } /* inner loop ends here(8-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1;  /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2;  /* Pointer update */
                pu1_dst  = pu1_dst - wd + 4 * dst_strd;   /* Pointer update */

            }
        }
        else if(0 == (wd & 7)) /* multiple of 8 case */
        {
            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 8)
                {
                    /*load 8 pixel values */
                    src_temp1_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1));
                    src_temp2_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2));
                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadu_si128((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadu_si128((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /* (pi2_src1[col] + pi2_src2[col]) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, src_temp8_8x16b);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp3_8x16b = _mm_adds_epi16(src_temp3_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);
                    src_temp7_8x16b = _mm_adds_epi16(src_temp7_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp3_8x16b = _mm_srai_epi16(src_temp3_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);
                    src_temp7_8x16b = _mm_srai_epi16(src_temp7_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);
                    src_temp3_8x16b = _mm_packus_epi16(src_temp3_8x16b, src_temp3_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp5_8x16b);
                    src_temp7_8x16b = _mm_packus_epi16(src_temp7_8x16b, src_temp7_8x16b);

                    /* store four 8-bit output values  */
                    _mm_storel_epi64((__m128i *)(pu1_dst + 0 * dst_strd), src_temp1_8x16b); /* row = 0*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 1 * dst_strd), src_temp3_8x16b); /* row = 2*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 2 * dst_strd), src_temp5_8x16b); /* row = 1*/
                    _mm_storel_epi64((__m128i *)(pu1_dst + 3 * dst_strd), src_temp7_8x16b); /* row = 3*/

                    /* To update pointer */
                    pi2_src1 += 8;
                    pi2_src2 += 8;
                    pu1_dst  += 8;

                } /* inner loop ends here(8-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1;  /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2;  /* Pointer update */
                pu1_dst  = pu1_dst - wd + 4 * dst_strd;   /* Pointer update */

            }
        }
        else /* wd multiple of 4 case*/
        {
            WORD32 dst0, dst1, dst2, dst3;

            /*  outer for loop starts from here */
            for(row = 0; row < ht; row += 4)
            {
                for(col = 0; col < wd; col += 4)
                {
                    /*load 4 pixel values from 7:0 pos. relative to cur. pos.*/
                    src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1));
                    /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                    src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2));

                    /* row = 1 */
                    src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + src_strd1));
                    src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + src_strd2));
                    /* row = 2 */
                    src_temp5_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 2 * src_strd1));
                    src_temp6_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 2 * src_strd2));
                    /* row = 3 */
                    src_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + 3 * src_strd1));
                    src_temp8_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + 3 * src_strd2));

                    /* Pack two rows together */
                    src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                    src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);
                    src_temp5_8x16b = _mm_unpacklo_epi64(src_temp5_8x16b, src_temp7_8x16b);
                    src_temp6_8x16b = _mm_unpacklo_epi64(src_temp6_8x16b, src_temp8_8x16b);

                    /* (pi2_src1[col] + pi2_src2[col]) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, src_temp6_8x16b);

                    /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                    src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);
                    src_temp5_8x16b = _mm_adds_epi16(src_temp5_8x16b, lvl_shift1_8x16b);

                    /* (i4_tmp >> shift) */
                    src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);
                    src_temp5_8x16b = _mm_srai_epi16(src_temp5_8x16b,  shift);

                    /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                    src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);
                    src_temp5_8x16b = _mm_packus_epi16(src_temp5_8x16b, src_temp5_8x16b);

                    dst0 = _mm_cvtsi128_si32(src_temp1_8x16b);
                    /* dst row = 1 to 3 */
                    src_temp2_8x16b = _mm_shuffle_epi32(src_temp1_8x16b, 1);
                    src_temp4_8x16b = _mm_shuffle_epi32(src_temp5_8x16b, 1);

                    /* store four 8-bit output values  */
                    *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                    dst1 = _mm_cvtsi128_si32(src_temp2_8x16b);
                    dst2 = _mm_cvtsi128_si32(src_temp5_8x16b);
                    dst3 = _mm_cvtsi128_si32(src_temp4_8x16b);

                    /* row = 1 to row = 3 */
                    *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;
                    *(WORD32 *)(&pu1_dst[2 * dst_strd]) = dst2;
                    *(WORD32 *)(&pu1_dst[3 * dst_strd]) = dst3;

                    /* To update pointer */
                    pi2_src1 += 4;
                    pi2_src2 += 4;
                    pu1_dst  += 4;

                } /* inner loop ends here(4-output values in single iteration) */

                pi2_src1 = pi2_src1 - wd + 4 * src_strd1; /* Pointer update */
                pi2_src2 = pi2_src2 - wd + 4 * src_strd2; /* Pointer update */
                pu1_dst  = pu1_dst  - wd + 4 * dst_strd;  /* Pointer update */

            }
        }
    }
    else /* ht multiple of 2 case and wd multiple of 4 case*/
    {

        WORD32 dst0, dst1;

        /*  outer for loop starts from here */
        for(row = 0; row < ht; row += 2)
        {
            for(col = 0; col < wd; col += 4)
            {
                /*load 4 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp1_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1));
                /*load 8 pixel values from 7:0 pos. relative to cur. pos.*/
                src_temp2_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2));

                /* row = 1 */
                src_temp3_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src1 + src_strd1));
                src_temp4_8x16b = _mm_loadl_epi64((__m128i *)(pi2_src2 + src_strd2));

                /* Pack two rows together */
                src_temp1_8x16b = _mm_unpacklo_epi64(src_temp1_8x16b, src_temp3_8x16b);
                src_temp2_8x16b = _mm_unpacklo_epi64(src_temp2_8x16b, src_temp4_8x16b);

                /* (pi2_src1[col] + pi2_src2[col]) */
                src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, src_temp2_8x16b);

                /* i4_tmp = (pi2_src1[col] + pi2_src2[col] + lvl_shift1 + lvl_shift2 + shift_value) */
                src_temp1_8x16b = _mm_adds_epi16(src_temp1_8x16b, lvl_shift1_8x16b);

                /* (i4_tmp >> shift) */
                src_temp1_8x16b = _mm_srai_epi16(src_temp1_8x16b,  shift);

                /* pu1_dst[col] = CLIP_U8(i4_tmp >> shift); */
                src_temp1_8x16b = _mm_packus_epi16(src_temp1_8x16b, src_temp1_8x16b);

                dst0 = _mm_cvtsi128_si32(src_temp1_8x16b);
                /* dst row = 1 to 3 */
                src_temp2_8x16b = _mm_shuffle_epi32(src_temp1_8x16b, 1);

                /* store four 8-bit output values  */
                *(WORD32 *)(&pu1_dst[0 * dst_strd]) = dst0;

                dst1 = _mm_cvtsi128_si32(src_temp2_8x16b);

                /* row = 1 to row = 3 */
                *(WORD32 *)(&pu1_dst[1 * dst_strd]) = dst1;

                /* To update pointer */
                pi2_src1 += 4;
                pi2_src2 += 4;
                pu1_dst  += 4;

            } /* inner loop ends here(4-output values in single iteration) */

            pi2_src1 = pi2_src1 - wd + 2 * src_strd1; /* Pointer update */
            pi2_src2 = pi2_src2 - wd + 2 * src_strd2; /* Pointer update */
            pu1_dst  = pu1_dst  - wd + 2 * dst_strd;  /* Pointer update */

        }

    }

}